

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O0

void dumb_record_click(DUMB_CLICK_REMOVER *cr,int32 pos,sample_t_conflict step)

{
  DUMB_CLICK *pDVar1;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  DUMB_CLICK *click;
  DUMB_CLICK_REMOVER *in_stack_ffffffffffffffe8;
  
  if ((in_RDI != (undefined8 *)0x0) && (in_EDX != 0)) {
    if (in_ESI == 0) {
      *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) - in_EDX;
    }
    else {
      pDVar1 = alloc_click(in_stack_ffffffffffffffe8);
      if (pDVar1 != (DUMB_CLICK *)0x0) {
        pDVar1->pos = in_ESI;
        pDVar1->step = in_EDX;
        pDVar1->next = (DUMB_CLICK *)*in_RDI;
        *in_RDI = pDVar1;
        *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
      }
    }
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_record_click(DUMB_CLICK_REMOVER *cr, int32 pos, sample_t step)
{
	DUMB_CLICK *click;

	ASSERT(pos >= 0);

	if (!cr || !step) return;

	if (pos == 0) {
		cr->offset -= step;
		return;
	}

	click = alloc_click(cr);
	if (!click) return;

	click->pos = pos;
	click->step = step;

	click->next = cr->click;
	cr->click = click;
	cr->n_clicks++;
}